

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O2

bool __thiscall Symbol::GetIsCommittedToSlot(Symbol *this)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01447bf0,DelayCapturePhase);
  bVar3 = true;
  if (((bVar2) && ((this->field_0x43 & 4) == 0)) &&
     (uVar1 = *(uint *)&this->scope->func->field_0xb4, (uVar1 & 2) == 0)) {
    bVar3 = SUB41((uVar1 & 4) >> 2,0);
  }
  return bVar3;
}

Assistant:

bool Symbol::GetIsCommittedToSlot() const
{
    if (!PHASE_ON1(Js::DelayCapturePhase))
    {
        return true;
    }
    return isCommittedToSlot || this->scope->GetFunc()->GetCallsEval() || this->scope->GetFunc()->GetChildCallsEval();
}